

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O1

vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
* testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            (vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,output_type *t)

{
  iterator iVar1;
  pointer pfVar2;
  _Fwd_list_node_base *p_Var3;
  _Fwd_list_impl _Var4;
  long lVar5;
  _Fwd_list_node_base *__to;
  _Self __tmp;
  _Fwd_list_node_base *p_Var6;
  difference_type __n;
  ulong uVar7;
  _Fwd_list_impl local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (t->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  if (p_Var6 != (_Fwd_list_node_base *)0x0) {
    uVar7 = 0;
    p_Var3 = p_Var6;
    do {
      p_Var3 = p_Var3->_M_next;
      uVar7 = uVar7 + 1;
    } while (p_Var3 != (_Fwd_list_node_base *)0x0);
    local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
      ::_M_realloc_insert<std::forward_list<int,std::allocator<int>>>
                ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                  *)__return_storage_ptr__,iVar1,
                 (forward_list<int,_std::allocator<int>_> *)&local_30);
      _Var4._M_head._M_next = local_30._M_head._M_next;
    }
    else {
      ((iVar1._M_current)->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next
           = (_Fwd_list_node_base *)0x0;
      local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      _Var4._M_head._M_next = local_30._M_head._M_next;
    }
    while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      p_Var3 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
      operator_delete((void *)_Var4._M_head._M_next,0x10);
      _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var3;
    }
    if (uVar7 != 1) {
      lVar5 = (uVar7 >> 1) + (ulong)(uVar7 >> 1 == 0);
      do {
        pfVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_head._M_next = (_Fwd_list_node_base)operator_new(0x10);
        *(_Fwd_list_node_base **)_Var4._M_head._M_next = (_Fwd_list_node_base *)0x0;
        *(undefined4 *)&((_Fwd_list_node_base *)((long)_Var4._M_head._M_next + 8))->_M_next =
             *(undefined4 *)&p_Var6[1]._M_next;
        *(_Fwd_list_node_base **)_Var4._M_head._M_next =
             (_Fwd_list_node_base *)
             (pfVar2->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head;
        (pfVar2->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head =
             _Var4._M_head._M_next;
        p_Var6 = p_Var6->_M_next;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    if (uVar7 != 1) {
      local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
        ::_M_realloc_insert<std::forward_list<int,std::allocator<int>>>
                  ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                    *)__return_storage_ptr__,iVar1,
                   (forward_list<int,_std::allocator<int>_> *)&local_30);
        _Var4._M_head._M_next = local_30._M_head._M_next;
      }
      else {
        ((iVar1._M_current)->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head.
        _M_next = (_Fwd_list_node_base *)0x0;
        local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        _Var4._M_head._M_next = local_30._M_head._M_next;
      }
      while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0) {
        p_Var3 = ((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
        operator_delete((void *)_Var4._M_head._M_next,0x10);
        _Var4._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var3;
      }
      if (p_Var6 != (_Fwd_list_node_base *)0x0) {
        pfVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        do {
          _Var4._M_head._M_next = (_Fwd_list_node_base)operator_new(0x10);
          *(_Fwd_list_node_base **)_Var4._M_head._M_next = (_Fwd_list_node_base *)0x0;
          *(undefined4 *)&((_Fwd_list_node_base *)((long)_Var4._M_head._M_next + 8))->_M_next =
               *(undefined4 *)&p_Var6[1]._M_next;
          *(_Fwd_list_node_base **)_Var4._M_head._M_next =
               (_Fwd_list_node_base *)
               pfVar2[1].super__Fwd_list_base<int,_std::allocator<int>_>._M_impl._M_head;
          pfVar2[1].super__Fwd_list_base<int,_std::allocator<int>_>._M_impl._M_head =
               _Var4._M_head._M_next;
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != (_Fwd_list_node_base *)0x0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<output_type> shrink(const output_type& t)
    {
      std::vector<output_type> v;
      if (t.empty()) return v;
      auto l = std::distance(t.cbegin(), t.cend()) / 2;
      auto it = t.cbegin();
      v.push_back(output_type());
      for (auto count = 0; count < l; count++, it++)
        v[0].push_front(*it);
      if (l > 0)
      {
        v.push_back(output_type());
        copy(it, t.cend(), std::front_inserter(v[1]));
      }
      return v;
    }